

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdmanager.cc
# Opt level: O0

void __thiscall bdNodeManager::~bdNodeManager(bdNodeManager *this)

{
  bdNodeManager *this_local;
  
  (this->super_bdNode).super_bdNodePublisher._vptr_bdNodePublisher =
       (_func_int **)&PTR_send_ping_001a5590;
  (this->super_BitDhtInterface)._vptr_BitDhtInterface = (_func_int **)&PTR_addBadPeer_001a5688;
  (*(this->super_bdNode).super_bdNodePublisher._vptr_bdNodePublisher[0x18])();
  bdBloom::~bdBloom(&this->mBloomFilter);
  std::__cxx11::list<BitDhtCallback_*,_std::allocator<BitDhtCallback_*>_>::~list(&this->mCallbacks);
  std::
  map<bdNodeId,_bdQueryPeer,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdQueryPeer>_>_>
  ::~map(&this->mActivePeers);
  bdNode::~bdNode(&this->super_bdNode);
  return;
}

Assistant:

bdNodeManager::~bdNodeManager() {
    stopDht();
}